

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O3

int dictionary_set(dictionary *d,char *key,char *val)

{
  size_t __nmemb;
  char **__src;
  uint uVar1;
  int iVar2;
  char **__ptr;
  char **ppcVar3;
  uint *__ptr_00;
  char *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  iVar2 = -1;
  if (key != (char *)0x0 && d != (dictionary *)0x0) {
    uVar1 = dictionary_hash(key);
    lVar5 = (long)d->n;
    lVar6 = d->size;
    if (0 < lVar6 && 0 < lVar5) {
      ppcVar3 = d->key;
      lVar7 = 0;
      do {
        if (((ppcVar3[lVar7] != (char *)0x0) && (uVar1 == d->hash[lVar7])) &&
           (iVar2 = strcmp(key,ppcVar3[lVar7]), iVar2 == 0)) {
          if (d->val[lVar7] != (char *)0x0) {
            free(d->val[lVar7]);
          }
          if (val == (char *)0x0) {
            pcVar4 = (char *)0x0;
          }
          else {
            pcVar4 = xstrdup(val);
          }
          d->val[lVar7] = pcVar4;
          return 0;
        }
        lVar7 = lVar7 + 1;
      } while (lVar6 != lVar7);
    }
    if (lVar6 == lVar5) {
      __nmemb = lVar6 * 2;
      __ptr = (char **)calloc(__nmemb,8);
      ppcVar3 = (char **)calloc(__nmemb,8);
      __ptr_00 = (uint *)calloc(__nmemb,4);
      if ((ppcVar3 == (char **)0x0 || __ptr == (char **)0x0) || __ptr_00 == (uint *)0x0) {
        if (__ptr != (char **)0x0) {
          free(__ptr);
        }
        if (ppcVar3 != (char **)0x0) {
          free(ppcVar3);
        }
        if (__ptr_00 == (uint *)0x0) {
          return -1;
        }
        free(__ptr_00);
        return -1;
      }
      __src = d->val;
      memcpy(__ptr,__src,lVar6 * 8);
      memcpy(ppcVar3,d->key,lVar6 * 8);
      memcpy(__ptr_00,d->hash,lVar6 << 2);
      free(__src);
      free(d->key);
      free(d->hash);
      lVar6 = d->size * 2;
      d->size = lVar6;
      d->val = __ptr;
      d->key = ppcVar3;
      d->hash = __ptr_00;
      lVar5 = (long)d->n;
    }
    else {
      ppcVar3 = d->key;
    }
    if (ppcVar3[lVar5] != (char *)0x0) {
      do {
        lVar5 = lVar5 + 1;
        if (lVar5 == lVar6) {
          lVar5 = 0;
        }
      } while (ppcVar3[lVar5] != (char *)0x0);
    }
    pcVar4 = xstrdup(key);
    d->key[lVar5] = pcVar4;
    iVar2 = 0;
    if (val == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = xstrdup(val);
    }
    d->val[lVar5] = pcVar4;
    d->hash[lVar5] = uVar1;
    d->n = d->n + 1;
  }
  return iVar2;
}

Assistant:

int dictionary_set(dictionary * d, const char * key, const char * val)
{
    ssize_t         i ;
    unsigned       hash ;

    if (d == NULL || key == NULL) return -1 ;

    /* Compute hash for this key */
    hash = dictionary_hash(key) ;
    /* Find if value is already in dictionary */
    if (d->n > 0) {
        for (i = 0 ; i < d->size ; i++) {
            if (d->key[i] == NULL)
                continue ;
            if (hash == d->hash[i]) { /* Same hash value */
                if (!strcmp(key, d->key[i])) {   /* Same key */
                    /* Found a value: modify and return */
                    if (d->val[i] != NULL)
                        free(d->val[i]);
                    d->val[i] = (val ? xstrdup(val) : NULL);
                    /* Value has been modified: return */
                    return 0 ;
                }
            }
        }
    }
    /* Add a new value */
    /* See if dictionary needs to grow */
    if (d->n == d->size) {
        /* Reached maximum size: reallocate dictionary */
        if (dictionary_grow(d) != 0)
            return -1;
    }

    /* Insert key in the first empty slot. Start at d->n and wrap at
       d->size. Because d->n < d->size this will necessarily
       terminate. */
    for (i = d->n ; d->key[i] ; ) {
        if (++i == d->size) i = 0;
    }
    /* Copy key */
    d->key[i]  = xstrdup(key);
    d->val[i]  = (val ? xstrdup(val) : NULL) ;
    d->hash[i] = hash;
    d->n ++ ;
    return 0 ;
}